

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O1

bool __thiscall pg::TSPMSolver::canlift(TSPMSolver *this,int node,int pl)

{
  int d;
  Game *pGVar1;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  int to;
  int iVar10;
  int *a;
  bool bVar11;
  
  uVar5 = (ulong)node;
  a = this->pms + this->k * uVar5;
  if (a[pl] != -1) {
    pGVar1 = (this->super_Solver).game;
    d = pGVar1->_priority[uVar5];
    piVar8 = pGVar1->_outedges;
    lVar6 = (long)pGVar1->_firstouts[uVar5];
    iVar10 = piVar8[lVar6];
    if ((uint)(((pGVar1->_owner)._bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) == pl) {
      bVar11 = iVar10 != -1;
      if (!bVar11) {
        return bVar11;
      }
      piVar8 = piVar8 + lVar6 + 1;
      while( true ) {
        uVar5 = (ulong)iVar10;
        bVar4 = false;
        if ((((this->super_Solver).disabled)->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) {
          Prog(this,this->tmp,this->pms + uVar5 * this->k,d,pl);
          bVar4 = pm_less(this,a,this->tmp,d,pl);
        }
        if (bVar4 != false) break;
        iVar10 = *piVar8;
        piVar8 = piVar8 + 1;
        bVar11 = iVar10 != -1;
        if (!bVar11) {
          return bVar11;
        }
      }
      return bVar11;
    }
    if (iVar10 != -1) {
      piVar8 = piVar8 + lVar6;
      iVar7 = -1;
      do {
        uVar5 = (ulong)iVar10;
        if (((((this->super_Solver).disabled)->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) &&
           (((Prog(this,this->tmp,this->pms + uVar5 * this->k,d,pl), iVar7 == -1 ||
             (bVar11 = pm_less(this,this->tmp,this->best,d,pl), bVar11)) &&
            (lVar6 = this->k, iVar7 = iVar10, 0 < lVar6)))) {
          piVar2 = this->tmp;
          piVar3 = this->best;
          lVar9 = 0;
          do {
            piVar3[lVar9] = piVar2[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar6 != lVar9);
        }
        iVar10 = piVar8[1];
        piVar8 = piVar8 + 1;
      } while (iVar10 != -1);
      if (iVar7 != -1) {
        bVar11 = pm_less(this,a,this->best,d,pl);
        return bVar11;
      }
    }
  }
  return false;
}

Assistant:

bool
TSPMSolver::canlift(int node, int pl)
{
    // obtain ptr to current progress measure
    int *pm = pms + k*node;

    // check if already Top
    if (pm[pl] == -1) return false;

    const int d = priority(node);

    if (owner(node) == pl) {
        // do max
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue;
            Prog(tmp, pms + k*to, d, pl);
            if (pm_less(pm, tmp, d, pl)) return true;
        }
        return false;
    } else {
        // do min
        int best_to = -1;
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue;
            Prog(tmp, pms + k*to, d, pl);
            if (best_to == -1 or pm_less(tmp, best, d, pl)) {
                for (int i=0; i<k; i++) best[i] = tmp[i];
                best_to = to;
            }
        }
        if (best_to == -1) return false;
        return pm_less(pm, best, d, pl);
    }
}